

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

bool tinyxml2::XMLUtil::ToUnsigned(char *str,uint *value)

{
  bool bVar1;
  int iVar2;
  char *local_30;
  uint *value_local;
  char *str_local;
  
  bVar1 = IsPrefixHex(str);
  if (bVar1) {
    local_30 = "%x";
  }
  else {
    local_30 = "%u";
  }
  iVar2 = __isoc99_sscanf(str,local_30,value);
  return iVar2 == 1;
}

Assistant:

bool XMLUtil::ToUnsigned(const char* str, unsigned* value)
{
    if (TIXML_SSCANF(str, IsPrefixHex(str) ? "%x" : "%u", value) == 1) {
        return true;
    }
    return false;
}